

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O3

Result<std::shared_ptr<wasm::Module>_> * __thiscall
Shell::makeModule(Result<std::shared_ptr<wasm::Module>_> *__return_storage_ptr__,Shell *this,
                 WASTModule *mod)

{
  undefined8 *puVar1;
  __index_type _Var2;
  int iVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  undefined8 this_00;
  Module *__tmp;
  undefined1 auVar4 [8];
  undefined1 local_610 [8];
  WasmBinaryReader reader;
  __index_type local_5f0;
  undefined8 *local_220;
  stringstream ss;
  undefined8 local_210;
  undefined8 uStack_208;
  long *local_78;
  long local_68 [2];
  char local_58;
  void *local_50;
  vector<char,_std::allocator<char>_> buffer;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Var2 = (mod->super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>).
          super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
          super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
          super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
          super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
          super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
          ._M_index;
  if (_Var2 == '\x01') {
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         *(pointer *)
          &(mod->super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>)
           .super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
           super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
           super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
           super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>.
           super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
           ._M_u;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_30,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(mod->
                       super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       ).
                       super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       .
                       super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       .
                       super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       .
                       super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       ._M_u + 8));
    this_00 = _Stack_30._M_pi;
    auVar4 = (undefined1  [8])
             buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  }
  else {
    if (_Var2 != '\0') {
      wasm::handle_unreachable
                ("unexpected module kind",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                 ,0x78);
    }
    local_610 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<wasm::Module,std::allocator<wasm::Module>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&reader,(Module **)local_610,
               (allocator<wasm::Module> *)&local_220);
    this_00 = _reader;
    auVar4 = local_610;
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_610;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_reader;
    iVar3 = *(int *)&(mod->
                     super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     ).
                     super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     .
                     super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                     ._M_u;
    if (iVar3 == 0) {
      local_58 = '\0';
      wasm::WATParser::parseModule
                (local_610,local_610,
                 *(undefined8 *)
                  ((long)&(mod->
                          super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          ).
                          super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          ._M_u + 0x10),
                 *(undefined8 *)
                  ((long)&(mod->
                          super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          ).
                          super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          .
                          super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                          ._M_u + 8));
      if ((local_58 == '\x01') && (local_58 = '\0', local_78 != local_68)) {
        operator_delete(local_78,local_68[0] + 1);
      }
      if (local_5f0 == '\x01') {
        local_220 = &local_210;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_220,local_610,_reader + (long)local_610);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                         super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                         super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                         super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                         super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                         super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> +
                 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
          super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
          super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
          super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
          super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
          super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> = puVar1;
        if (local_220 == &local_210) {
          *puVar1 = local_210;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                   super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                   super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                   super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                   super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                   super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x18) =
               uStack_208;
        }
        else {
          *(undefined8 **)
           &(__return_storage_ptr__->val).
            super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
            super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
            super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
            super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
            super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
            super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> = local_220;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                   super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                   super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                   super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                   super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                   super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x10) =
               local_210;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 8) = _ss;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                 super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20) =
             '\x01';
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_610);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return __return_storage_ptr__;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        return __return_storage_ptr__;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_610);
    }
    else if (iVar3 == 1) {
      __first._M_current =
           *(char **)((long)&(mod->
                             super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             ).
                             super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             .
                             super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             .
                             super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             .
                             super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             ._M_u + 8);
      std::vector<char,std::allocator<char>>::
      vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                ((vector<char,std::allocator<char>> *)&local_50,__first,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(__first._M_current +
                   *(long *)((long)&(mod->
                                    super__Variant_base<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    ).
                                    super__Move_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                    ._M_u + 0x10)),(allocator_type *)local_610);
      wasm::WasmBinaryReader::WasmBinaryReader
                ((WasmBinaryReader *)local_610,(Module *)auVar4,(FeatureSet)0x3fffff,
                 (vector *)&local_50,(vector *)&wasm::defaultEmptySourceMap);
      wasm::WasmBinaryReader::read();
      wasm::WasmBinaryReader::~WasmBinaryReader((WasmBinaryReader *)local_610);
      if (local_50 != (void *)0x0) {
        operator_delete(local_50,(long)buffer.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)local_50);
      }
    }
  }
  (((Module *)auVar4)->features).features = 0x3fffff;
  *(undefined1 (*) [8])
   &(__return_storage_ptr__->val).super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> = auVar4;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 8) = this_00;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
           super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err> + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<std::shared_ptr<Module>> makeModule(WASTModule& mod) {
    std::shared_ptr<Module> wasm;
    if (auto* quoted = std::get_if<QuotedModule>(&mod)) {
      wasm = std::make_shared<Module>();
      switch (quoted->type) {
        case QuotedModuleType::Text: {
          CHECK_ERR(parseModule(*wasm, quoted->module));
          break;
        }
        case QuotedModuleType::Binary: {
          std::vector<char> buffer(quoted->module.begin(),
                                   quoted->module.end());
          WasmBinaryReader reader(*wasm, FeatureSet::All, buffer);
          try {
            reader.read();
          } catch (ParseException& p) {
            std::stringstream ss;
            p.dump(ss);
            return Err{ss.str()};
          }
          break;
        }
      }
    } else if (auto* ptr = std::get_if<std::shared_ptr<Module>>(&mod)) {
      wasm = *ptr;
    } else {
      WASM_UNREACHABLE("unexpected module kind");
    }
    wasm->features = FeatureSet::All;
    return wasm;
  }